

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::setCurrentRobotConfiguration
          (InverseKinematics *this,MatrixView<const_double> *baseConfiguration,
          Span<const_double,__1L> jointConfiguration)

{
  VectorDynSize aVStack_148 [32];
  MatrixView<const_double> local_128;
  Transform local_f8 [96];
  MatrixFixSize local_98 [128];
  
  if ((baseConfiguration->m_rows == 4) && (baseConfiguration->m_cols == 4)) {
    local_128.m_storage = baseConfiguration->m_storage;
    local_128.m_rows = 4;
    local_128.m_cols = 4;
    local_128.m_storageOrder = baseConfiguration->m_storageOrder;
    local_128.m_innerStride = baseConfiguration->m_innerStride;
    local_128.m_outerStride = baseConfiguration->m_outerStride;
    MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_98,&local_128);
    iDynTree::Transform::Transform(local_f8,local_98);
    iDynTree::VectorDynSize::VectorDynSize
              (aVStack_148,jointConfiguration.storage_.super_extent_type<_1L>.size_.size_,
               jointConfiguration.storage_.data_);
    iDynTree::reportError
              ("InverseKinematics","",
               "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
    iDynTree::VectorDynSize::~VectorDynSize(aVStack_148);
  }
  else {
    iDynTree::reportError
              ("InverseKinematics","getWorldBaseTransform","Wrong size in input world_T_base");
  }
  return false;
}

Assistant:

bool InverseKinematics::setCurrentRobotConfiguration(iDynTree::MatrixView<const double> baseConfiguration,
                                                         iDynTree::Span<const double> jointConfiguration)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (baseConfiguration.rows() == expected_transform_rows)
            && (baseConfiguration.cols() == expected_transform_cols);
        if( !ok )
        {
            reportError("InverseKinematics","getWorldBaseTransform","Wrong size in input world_T_base");
            return false;
        }

        return this->setCurrentRobotConfiguration(Transform(baseConfiguration), jointConfiguration);
    }